

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::UnaryScatter<duckdb::StddevState,double,duckdb::STDDevSampOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  FunctionData *pFVar2;
  long lVar3;
  long *plVar4;
  double *idata;
  StddevState **states_00;
  idx_t iVar5;
  idx_t iVar6;
  idx_t iVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  AggregateUnaryInput input_data;
  UnifiedVectorFormat sdata;
  AggregateUnaryInput local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long *local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if (*input == (Vector)0x0) {
    if (*states == (Vector)0x0) {
      idata = *(double **)(input + 0x20);
      states_00 = *(StddevState ***)(states + 0x20);
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::StddevState,double,duckdb::STDDevSampOperation>
                (idata,aggr_input_data,states_00,(ValidityMask *)(input + 0x28),count);
      return;
    }
  }
  else if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) != (byte *)0x0) && ((**(byte **)(input + 0x28) & 1) == 0)) {
      return;
    }
    local_b8.input_mask = (ValidityMask *)(input + 0x28);
    local_b8.input_idx = 0;
    local_b8.input = aggr_input_data;
    STDDevBaseOperation::ConstantOperation<double,duckdb::StddevState,duckdb::STDDevSampOperation>
              ((StddevState *)**(undefined8 **)(states + 0x20),*(double **)(input + 0x20),&local_b8,
               count);
    return;
  }
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
  duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
  if (local_b8.input_idx == 0) {
    if (count != 0) {
      pFVar2 = ((local_b8.input)->bind_data).ptr;
      lVar3 = *local_70;
      iVar5 = 0;
      do {
        iVar6 = iVar5;
        if (pFVar2 != (FunctionData *)0x0) {
          iVar6 = (idx_t)*(uint *)(pFVar2 + iVar5 * 4);
        }
        iVar7 = iVar5;
        if (lVar3 != 0) {
          iVar7 = (idx_t)*(uint *)(lVar3 + iVar5 * 4);
        }
        plVar4 = *(long **)(local_68 + iVar7 * 8);
        lVar8 = *plVar4 + 1;
        *plVar4 = lVar8;
        puVar1 = (&((local_b8.input_mask)->super_TemplatedValidityMask<unsigned_long>).validity_mask
                 )[iVar6];
        dVar9 = (double)puVar1 - (double)plVar4[1];
        auVar12._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar12._0_8_ = lVar8;
        auVar12._12_4_ = 0x45300000;
        dVar10 = dVar9 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) +
                 (double)plVar4[1];
        plVar4[1] = (long)dVar10;
        plVar4[2] = (long)(((double)puVar1 - dVar10) * dVar9 + (double)plVar4[2]);
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
  }
  else if (count != 0) {
    pFVar2 = ((local_b8.input)->bind_data).ptr;
    lVar3 = *local_70;
    iVar5 = 0;
    do {
      iVar6 = iVar5;
      if (pFVar2 != (FunctionData *)0x0) {
        iVar6 = (idx_t)*(uint *)(pFVar2 + iVar5 * 4);
      }
      iVar7 = iVar5;
      if (lVar3 != 0) {
        iVar7 = (idx_t)*(uint *)(lVar3 + iVar5 * 4);
      }
      if ((*(ulong *)(local_b8.input_idx + (iVar6 >> 6) * 8) >> (iVar6 & 0x3f) & 1) != 0) {
        plVar4 = *(long **)(local_68 + iVar7 * 8);
        lVar8 = *plVar4 + 1;
        *plVar4 = lVar8;
        puVar1 = (&((local_b8.input_mask)->super_TemplatedValidityMask<unsigned_long>).validity_mask
                 )[iVar6];
        dVar9 = (double)puVar1 - (double)plVar4[1];
        auVar11._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar11._0_8_ = lVar8;
        auVar11._12_4_ = 0x45300000;
        dVar10 = dVar9 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) +
                 (double)plVar4[1];
        plVar4[1] = (long)dVar10;
        plVar4[2] = (long)(((double)puVar1 - dVar10) * dVar9 + (double)plVar4[2]);
      }
      iVar5 = iVar5 + 1;
    } while (count != iVar5);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}